

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O0

bool __thiscall ConstTpl::operator<(ConstTpl *this,ConstTpl *op2)

{
  const_type cVar1;
  ConstTpl *op2_local;
  ConstTpl *this_local;
  
  if (this->type == op2->type) {
    cVar1 = this->type;
    if (cVar1 == real) {
      this_local._7_1_ = this->value_real < op2->value_real;
    }
    else {
      if (cVar1 == handle) {
        if ((this->value).handle_index != (op2->value).handle_index) {
          return (this->value).handle_index < (op2->value).handle_index;
        }
        if (this->select != op2->select) {
          return (int)this->select < (int)op2->select;
        }
      }
      else if (cVar1 == spaceid) {
        return (this->value).spaceid < (op2->value).spaceid;
      }
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = (int)this->type < (int)op2->type;
  }
  return this_local._7_1_;
}

Assistant:

bool ConstTpl::operator<(const ConstTpl &op2) const

{
  if (type != op2.type) return (type < op2.type);
  switch(type) {
  case real:
    return (value_real < op2.value_real);
  case handle:
    if (value.handle_index != op2.value.handle_index)
      return (value.handle_index < op2.value.handle_index);
    if (select != op2.select) return (select < op2.select);
    break;
  case spaceid:
    return (value.spaceid < op2.value.spaceid);
  default:			// Nothing additional to compare
    break;
  }
  return false;
}